

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actor.hpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
actorpp::detail::ChannelImpl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::pop
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          ChannelImpl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *this)

{
  _Elt_pointer pvVar1;
  pointer puVar2;
  logic_error *this_00;
  unique_lock<std::mutex> lock;
  
  std::unique_lock<std::mutex>::unique_lock
            (&lock,&((this->actor_impl).
                     super___shared_ptr<actorpp::detail::ActorImpl,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->mut);
  pvVar1 = (this->elements).c.
           super__Deque_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if ((this->elements).c.
      super__Deque_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur != pvVar1) {
    puVar2 = (pvVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_start =
         (pvVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_finish = puVar2;
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pvVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (pvVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pvVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pvVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    deque<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::pop_front(&(this->elements).c);
    std::unique_lock<std::mutex>::~unique_lock(&lock);
    return __return_storage_ptr__;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"called pop() on unreadable channel");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

T pop() {
    std::unique_lock<std::mutex> lock(actor_impl->mut);
    if (!readable_with_lock())
      throw std::logic_error("called pop() on unreadable channel");
    T element = std::move(elements.front());
    elements.pop();
    return element;
  }